

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall
wabt::interp::Thread::
DoSimdWiden<wabt::interp::Simd<unsigned_int,(unsigned_char)4>,wabt::interp::Simd<unsigned_short,(unsigned_char)8>,false>
          (Thread *this)

{
  Simd<unsigned_int,_(unsigned_char)__x04_> value;
  byte local_31;
  undefined8 uStack_30;
  u8 i;
  Simd<unsigned_int,_(unsigned_char)__x04_> result;
  Simd<unsigned_short,_(unsigned_char)__b_> val;
  Thread *this_local;
  
  Pop<wabt::interp::Simd<unsigned_short,(unsigned_char)8>>(this);
  for (local_31 = 0; local_31 < 4; local_31 = local_31 + 1) {
    *(uint *)(val.v + (ulong)local_31 * 2 + -0xc) = (uint)val.v[(long)(int)(local_31 + 4) + -4];
  }
  value.v._8_8_ = result.v._0_8_;
  value.v._0_8_ = uStack_30;
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,value);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdWiden() {
  auto val = Pop<T>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] = val.v[(low ? 0 : S::lanes) + i];
  }
  Push(result);
  return RunResult::Ok;
}